

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.cc
# Opt level: O2

void RigidBodyDynamics::jcalc_X_lambda_S(Model *model,uint joint_id,VectorNd *q)

{
  double dVar1;
  double dVar2;
  JointType JVar3;
  uint uVar4;
  pointer pJVar5;
  double *pdVar6;
  pointer pSVar7;
  pointer pSVar8;
  SpatialVector *pSVar9;
  CustomJoint *pCVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  pointer pMVar15;
  RBDLError *this;
  long lVar16;
  long lVar17;
  Vector3d *pVVar18;
  SpatialTransform *pSVar19;
  pointer pSVar20;
  byte bVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dVar24;
  SpatialTransform local_178;
  SpatialTransform XJ;
  string local_b8;
  Quaternion local_98;
  Vector3d trans;
  
  bVar21 = 0;
  pJVar5 = (model->mJoints).
           super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
           .
           super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  JVar3 = pJVar5[joint_id].mJointType;
  if (JVar3 == JointTypeHelical) {
    jcalc_XJ(&XJ,model,joint_id,q);
    Math::SpatialTransform::operator*
              (&local_178,&XJ,
               (model->X_T).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start + joint_id);
    pSVar7 = (model->X_lambda).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar19 = &local_178;
    pSVar20 = pSVar7 + joint_id;
    for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
      *(double *)&(pSVar20->E).super_Matrix3d =
           (pSVar19->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pSVar19 = (SpatialTransform *)((long)pSVar19 + (ulong)bVar21 * -0x10 + 8);
      pSVar20 = (pointer)((long)pSVar20 + ((ulong)bVar21 * -2 + 1) * 8);
    }
    *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
         local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    *(double *)
     &pSVar7[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
    *(double *)
     ((long)&pSVar7[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
         local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[1];
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] =
         (double)(model->mJoints).
                 super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ._M_impl.super__Vector_impl_data._M_start[joint_id].mJointAxes;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] =
         (double)((long)&((SpatialVector *)
                         local_178.E.super_Matrix3d.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array[3])->super_Matrix<double,_6,_1,_0,_6,_1> + 0x18);
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] = 1.48219693752374e-323;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[6] = 2.96439387504748e-323;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = (double)&XJ;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&trans,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>,_0>_>
                *)&local_178);
    pSVar8 = (model->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    pSVar9 = (model->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start[joint_id].mJointAxes;
    dVar11 = *(double *)((long)&pSVar9->super_Matrix<double,_6,_1,_0,_6,_1> + 0x10);
    dVar1 = *(double *)((long)&pSVar9->super_Matrix<double,_6,_1,_0,_6,_1> + 8);
    *(undefined8 *)
     &pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
         *(undefined8 *)&pSVar9->super_Matrix<double,_6,_1,_0,_6,_1>;
    *(double *)
     ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = dVar1;
    *(double *)
     ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = dVar11;
    pdVar6 = (double *)
             ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
    *pdVar6 = trans.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0];
    pdVar6[1] = trans.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[1];
    *(double *)
     ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) =
         trans.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
         .m_data.array[2];
    return;
  }
  if (JVar3 == JointTypeRevoluteY) {
    uVar4 = pJVar5[joint_id].q_index;
    pdVar6 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar11 = sin(pdVar6[uVar4]);
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = cos(pdVar6[uVar4]);
    uVar22 = SUB84(local_178.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[0],0);
    uVar23 = (undefined4)
             ((ulong)local_178.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[0] >> 0x20);
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[6] = -dVar11;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] = 1.0;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] = 0.0;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[7] = 0.0;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = dVar11;
LAB_00241301:
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] = 0.0;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = 0.0;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[8] = (double)CONCAT44(uVar23,uVar22);
  }
  else {
    if (JVar3 != JointTypeRevoluteZ) {
      if (JVar3 != JointTypeRevoluteX) {
        if (pJVar5[joint_id].mDoFCount != 1) {
          switch(JVar3) {
          case JointTypeSpherical:
            Model::GetQuaternion(&local_98,model,joint_id,q);
            Math::Quaternion::toMatrix(&local_98);
            lVar16 = 9;
            pVVar18 = &trans;
            pSVar19 = &local_178;
            for (lVar17 = lVar16; lVar17 != 0; lVar17 = lVar17 + -1) {
              (pSVar19->E).super_Matrix3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
                   = (pVVar18->super_Vector3d).
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[0];
              pVVar18 = (Vector3d *)((long)pVVar18 + ((ulong)bVar21 * -2 + 1) * 8);
              pSVar19 = (SpatialTransform *)((long)pSVar19 + (ulong)bVar21 * -0x10 + 8);
            }
            local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[2] = 0.0;
            local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[0] = 0.0;
            local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1] = 0.0;
            Math::SpatialTransform::operator*
                      (&XJ,&local_178,
                       (model->X_T).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + joint_id);
            pSVar7 = (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pSVar19 = &XJ;
            pSVar20 = pSVar7 + joint_id;
            for (; lVar16 != 0; lVar16 = lVar16 + -1) {
              *(double *)&(pSVar20->E).super_Matrix3d =
                   (pSVar19->E).super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[0];
              pSVar19 = (SpatialTransform *)((long)pSVar19 + (ulong)bVar21 * -0x10 + 8);
              pSVar20 = (pointer)((long)pSVar20 + ((ulong)bVar21 * -2 + 1) * 8);
            }
            *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
                 XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[2];
            *(double *)
             &pSVar7[joint_id].r.super_Vector3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
                 XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0];
            *(double *)
             ((long)&pSVar7[joint_id].r.super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
                 XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[1];
            Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::setZero
                      ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                       ((model->multdof3_S).
                        super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        .
                        super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + joint_id));
            pMVar15 = (model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)
             &pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
              m_storage = 0x3ff0000000000000;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 0x38) = 1.0;
            break;
          case JointTypeEulerZYX:
            uVar4 = pJVar5[joint_id].q_index;
            pdVar6 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data;
            dVar11 = pdVar6[uVar4];
            dVar1 = pdVar6[uVar4 + 1];
            dVar2 = pdVar6[uVar4 + 2];
            dVar12 = sin(dVar11);
            dVar11 = cos(dVar11);
            dVar13 = sin(dVar1);
            dVar1 = cos(dVar1);
            dVar14 = sin(dVar2);
            dVar2 = cos(dVar2);
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[0] = dVar11 * dVar1;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[3] = dVar12 * dVar1;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[1] = dVar11 * dVar13 * dVar14 + -dVar12 * dVar2;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[2] = dVar11 * dVar13 * dVar2 + dVar14 * dVar12;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[4] = dVar13 * dVar12 * dVar14 + dVar2 * dVar11;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[5] = dVar13 * dVar12 * dVar2 + -dVar11 * dVar14;
            local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[2] = 0.0;
            local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[0] = 0.0;
            local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1] = 0.0;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[6] = -dVar13;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[7] = dVar1 * dVar14;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[8] = dVar1 * dVar2;
            Math::SpatialTransform::operator*
                      (&XJ,&local_178,
                       (model->X_T).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + joint_id);
            pSVar7 = (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pSVar19 = &XJ;
            pSVar20 = pSVar7 + joint_id;
            for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
              *(double *)&(pSVar20->E).super_Matrix3d =
                   (pSVar19->E).super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[0];
              pSVar19 = (SpatialTransform *)((long)pSVar19 + (ulong)bVar21 * -0x10 + 8);
              pSVar20 = (pointer)((long)pSVar20 + ((ulong)bVar21 * -2 + 1) * 8);
            }
            *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
                 XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[2];
            *(double *)
             &pSVar7[joint_id].r.super_Vector3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
                 XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0];
            *(double *)
             ((long)&pSVar7[joint_id].r.super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
                 XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[1];
            Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::setZero
                      ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                       ((model->multdof3_S).
                        super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        .
                        super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + joint_id));
            pMVar15 = (model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(double *)
             &pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
              m_storage = -dVar13;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 0x60) = 1.0;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 8) = dVar1 * dVar14;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 0x38) = dVar2;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 0x10) = dVar1 * dVar2;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 0x40) = -dVar14;
            return;
          case JointTypeEulerXYZ:
            uVar4 = pJVar5[joint_id].q_index;
            pdVar6 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data;
            dVar11 = pdVar6[uVar4];
            dVar1 = pdVar6[uVar4 + 1];
            dVar2 = pdVar6[uVar4 + 2];
            dVar12 = sin(dVar11);
            dVar11 = cos(dVar11);
            dVar13 = sin(dVar1);
            dVar1 = cos(dVar1);
            dVar14 = sin(dVar2);
            dVar2 = cos(dVar2);
            dVar24 = dVar1 * -dVar14;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[5] = -dVar1 * dVar12;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[8] = dVar1 * dVar11;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[3] = dVar14 * dVar11 + dVar2 * dVar13 * dVar12;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[4] = dVar2 * dVar11 + -dVar14 * dVar13 * dVar12;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[6] = dVar14 * dVar12 + -dVar2 * dVar13 * dVar11;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[7] = dVar2 * dVar12 + dVar14 * dVar13 * dVar11;
            local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[2] = 0.0;
            local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[0] = 0.0;
            local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1] = 0.0;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[0] = dVar1 * dVar2;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[1] = dVar24;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[2] = dVar13;
            Math::SpatialTransform::operator*
                      (&XJ,&local_178,
                       (model->X_T).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + joint_id);
            pSVar7 = (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pSVar19 = &XJ;
            pSVar20 = pSVar7 + joint_id;
            for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
              *(double *)&(pSVar20->E).super_Matrix3d =
                   (pSVar19->E).super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[0];
              pSVar19 = (SpatialTransform *)((long)pSVar19 + (ulong)bVar21 * -0x10 + 8);
              pSVar20 = (pointer)((long)pSVar20 + ((ulong)bVar21 * -2 + 1) * 8);
            }
            *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
                 XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[2];
            *(double *)
             &pSVar7[joint_id].r.super_Vector3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
                 XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0];
            *(double *)
             ((long)&pSVar7[joint_id].r.super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
                 XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[1];
            Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::setZero
                      ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                       ((model->multdof3_S).
                        super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        .
                        super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + joint_id));
            pMVar15 = (model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(double *)
             &pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
              m_storage = dVar1 * dVar2;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 0x30) = dVar14;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 8) = dVar24;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 0x38) = dVar2;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 0x10) = dVar13;
            break;
          case JointTypeEulerYXZ:
            uVar4 = pJVar5[joint_id].q_index;
            pdVar6 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data;
            dVar11 = pdVar6[uVar4];
            dVar1 = pdVar6[uVar4 + 1];
            dVar2 = pdVar6[uVar4 + 2];
            dVar12 = sin(dVar11);
            dVar11 = cos(dVar11);
            dVar13 = sin(dVar1);
            dVar1 = cos(dVar1);
            dVar14 = sin(dVar2);
            dVar2 = cos(dVar2);
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[2] = dVar12 * dVar1;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[8] = dVar1 * dVar11;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[0] = dVar2 * dVar11 + dVar12 * dVar14 * dVar13;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[1] = -dVar14 * dVar11 + dVar12 * dVar2 * dVar13;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[6] = -dVar2 * dVar12 + dVar11 * dVar14 * dVar13;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[7] = dVar14 * dVar12 + dVar11 * dVar2 * dVar13;
            local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[2] = 0.0;
            local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[0] = 0.0;
            local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1] = 0.0;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[3] = dVar1 * dVar14;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[4] = dVar1 * dVar2;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[5] = -dVar13;
            Math::SpatialTransform::operator*
                      (&XJ,&local_178,
                       (model->X_T).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + joint_id);
            pSVar7 = (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pSVar19 = &XJ;
            pSVar20 = pSVar7 + joint_id;
            for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
              *(double *)&(pSVar20->E).super_Matrix3d =
                   (pSVar19->E).super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[0];
              pSVar19 = (SpatialTransform *)((long)pSVar19 + (ulong)bVar21 * -0x10 + 8);
              pSVar20 = (pointer)((long)pSVar20 + ((ulong)bVar21 * -2 + 1) * 8);
            }
            *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
                 XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[2];
            *(double *)
             &pSVar7[joint_id].r.super_Vector3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
                 XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0];
            *(double *)
             ((long)&pSVar7[joint_id].r.super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
                 XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[1];
            Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::setZero
                      ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                       ((model->multdof3_S).
                        super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        .
                        super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + joint_id));
            pMVar15 = (model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(double *)
             &pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
              m_storage = dVar1 * dVar14;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 0x30) = dVar2;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 8) = dVar1 * dVar2;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 0x38) = -dVar14;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 0x10) = -dVar13;
            break;
          case JointTypeTranslationXYZ:
            uVar4 = pJVar5[joint_id].q_index;
            pdVar6 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data;
            local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[0] = pdVar6[uVar4];
            local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1] = pdVar6[uVar4 + 1];
            local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[2] = pdVar6[uVar4 + 2];
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[3] = 0.0;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[1] = 0.0;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[2] = 0.0;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[7] = 0.0;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[5] = 0.0;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[6] = 0.0;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[0] = 1.0;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[4] = 1.0;
            local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[8] = 1.0;
            Math::SpatialTransform::operator*
                      (&XJ,&local_178,
                       (model->X_T).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + joint_id);
            pSVar7 = (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pSVar19 = &XJ;
            pSVar20 = pSVar7 + joint_id;
            for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
              *(double *)&(pSVar20->E).super_Matrix3d =
                   (pSVar19->E).super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[0];
              pSVar19 = (SpatialTransform *)((long)pSVar19 + (ulong)bVar21 * -0x10 + 8);
              pSVar20 = (pointer)((long)pSVar20 + ((ulong)bVar21 * -2 + 1) * 8);
            }
            *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
                 XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[2];
            *(double *)
             &pSVar7[joint_id].r.super_Vector3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
                 XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0];
            *(double *)
             ((long)&pSVar7[joint_id].r.super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
                 XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[1];
            Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::setZero
                      ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                       ((model->multdof3_S).
                        super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        .
                        super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + joint_id));
            pMVar15 = (model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 0x18) = 1.0;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 0x50) = 1.0;
            *(double *)
             ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 0x88) = 1.0;
            return;
          default:
            this = (RBDLError *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b8,"Error: invalid joint type!",(allocator<char> *)&XJ);
            Errors::RBDLError::RBDLError(this,&local_b8);
            __cxa_throw(this,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
          case JointTypeCustom:
switchD_00241566_caseD_14:
            pCVar10 = (model->mCustomJoints).
                      super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[pJVar5[joint_id].custom_joint_index]
            ;
            (**(code **)(*(long *)pCVar10 + 0x18))(pCVar10,model);
            return;
          }
          *(double *)
           ((long)&pMVar15[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                   m_storage + 0x70) = 1.0;
          return;
        }
        if (JVar3 == JointTypeCustom) goto switchD_00241566_caseD_14;
        jcalc_XJ(&local_178,model,joint_id,q);
        Math::SpatialTransform::operator*
                  (&XJ,&local_178,
                   (model->X_T).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + joint_id);
        pSVar7 = (model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar19 = &XJ;
        pSVar20 = pSVar7 + joint_id;
        for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
          *(double *)&(pSVar20->E).super_Matrix3d =
               (pSVar19->E).super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [0];
          pSVar19 = (SpatialTransform *)((long)pSVar19 + (ulong)bVar21 * -0x10 + 8);
          pSVar20 = (pointer)((long)pSVar20 + ((ulong)bVar21 * -2 + 1) * 8);
        }
        *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
             XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[2];
        *(double *)
         &pSVar7[joint_id].r.super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
             XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
        *(double *)
         ((long)&pSVar7[joint_id].r.super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
             XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[1];
        goto LAB_002413cd;
      }
      uVar4 = pJVar5[joint_id].q_index;
      pdVar6 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      dVar11 = sin(pdVar6[uVar4]);
      local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[4] = cos(pdVar6[uVar4]);
      uVar22 = SUB84(local_178.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[4],0);
      uVar23 = (undefined4)
               ((ulong)local_178.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[4] >> 0x20);
      local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[5] = -dVar11;
      local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = 1.0;
      local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[2] = 0.0;
      local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[6] = 0.0;
      local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[7] = dVar11;
      goto LAB_00241301;
    }
    uVar4 = pJVar5[joint_id].q_index;
    pdVar6 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar11 = sin(pdVar6[uVar4]);
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = cos(pdVar6[uVar4]);
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = -dVar11;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = 0.0;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] = 0.0;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[6] = 0.0;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[7] = 0.0;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[8] = 1.0;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] = dVar11;
    local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] =
         local_178.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[0];
  }
  local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  local_178.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  Math::SpatialTransform::operator*
            (&XJ,&local_178,
             (model->X_T).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start + joint_id);
  pSVar7 = (model->X_lambda).
           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           .
           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar19 = &XJ;
  pSVar20 = pSVar7 + joint_id;
  for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
    *(double *)&(pSVar20->E).super_Matrix3d =
         (pSVar19->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[0];
    pSVar19 = (SpatialTransform *)((long)pSVar19 + (ulong)bVar21 * -0x10 + 8);
    pSVar20 = (pointer)((long)pSVar20 + ((ulong)bVar21 * -2 + 1) * 8);
  }
  *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
       XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
       m_data.array[2];
  *(double *)
   &pSVar7[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
       XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
       m_data.array[0];
  *(double *)
   ((long)&pSVar7[joint_id].r.super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
       XJ.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
       m_data.array[1];
LAB_002413cd:
  Eigen::internal::call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
            (&(model->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>
             ,&((model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start[joint_id].mJointAxes)->
               super_Matrix<double,_6,_1,_0,_6,_1>);
  return;
}

Assistant:

RBDL_DLLAPI void jcalc_X_lambda_S (
    Model &model,
    unsigned int joint_id,
    const VectorNd &q
    ) {
  // exception if we calculate it for the root body
  assert (joint_id > 0);

  if (model.mJoints[joint_id].mJointType == JointTypeRevoluteX) {
    model.X_lambda[joint_id] = 
      Xrotx (q[model.mJoints[joint_id].q_index]) * model.X_T[joint_id];
    model.S[joint_id] = model.mJoints[joint_id].mJointAxes[0];
  } else if (model.mJoints[joint_id].mJointType == JointTypeRevoluteY) {
    model.X_lambda[joint_id] = 
      Xroty (q[model.mJoints[joint_id].q_index]) * model.X_T[joint_id];
    model.S[joint_id] = model.mJoints[joint_id].mJointAxes[0];
  } else if (model.mJoints[joint_id].mJointType == JointTypeRevoluteZ) {
    model.X_lambda[joint_id] = 
      Xrotz (q[model.mJoints[joint_id].q_index]) * model.X_T[joint_id];
    model.S[joint_id] = model.mJoints[joint_id].mJointAxes[0];
  } else if (model.mJoints[joint_id].mJointType == JointTypeHelical){
    SpatialTransform XJ = jcalc_XJ (model, joint_id, q);
    model.X_lambda[joint_id] = XJ * model.X_T[joint_id];
    // Set the joint axis
    Vector3d trans = XJ.E * model.mJoints[joint_id].mJointAxes[0].block<3, 1>(3,0);
    
    model.S[joint_id] = SpatialVector(model.mJoints[joint_id].mJointAxes[0][0],
           model.mJoints[joint_id].mJointAxes[0][1],
           model.mJoints[joint_id].mJointAxes[0][2],
           trans[0], trans[1], trans[2]);
  } else if (model.mJoints[joint_id].mDoFCount == 1
      && model.mJoints[joint_id].mJointType != JointTypeCustom){
    model.X_lambda[joint_id] = 
      jcalc_XJ (model, joint_id, q) * model.X_T[joint_id];
    model.S[joint_id] = model.mJoints[joint_id].mJointAxes[0];
  } else if (model.mJoints[joint_id].mJointType == JointTypeSpherical) {
    model.X_lambda[joint_id] = SpatialTransform (
        model.GetQuaternion (joint_id, q).toMatrix(),
        Vector3d (0., 0., 0.))
      * model.X_T[joint_id];

    model.multdof3_S[joint_id].setZero();

    model.multdof3_S[joint_id](0,0) = 1.;
    model.multdof3_S[joint_id](1,1) = 1.;
    model.multdof3_S[joint_id](2,2) = 1.;
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerZYX) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_lambda[joint_id] = SpatialTransform ( 
        Matrix3d(
          c0 * c1, s0 * c1, -s1,
          c0 * s1 * s2 - s0 * c2, s0 * s1 * s2 + c0 * c2, c1 * s2,
          c0 * s1 * c2 + s0 * s2, s0 * s1 * c2 - c0 * s2, c1 * c2
          ),
        Vector3d (0., 0., 0.))
      * model.X_T[joint_id];

    model.multdof3_S[joint_id].setZero();

    model.multdof3_S[joint_id](0,0) = -s1;
    model.multdof3_S[joint_id](0,2) = 1.;

    model.multdof3_S[joint_id](1,0) = c1 * s2;
    model.multdof3_S[joint_id](1,1) = c2;

    model.multdof3_S[joint_id](2,0) = c1 * c2;
    model.multdof3_S[joint_id](2,1) = - s2;
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerXYZ) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_lambda[joint_id] = SpatialTransform (
        Matrix3d(
          c2 * c1, s2 * c0 + c2 * s1 * s0, s2 * s0 - c2 * s1 * c0,
          -s2 * c1, c2 * c0 - s2 * s1 * s0, c2 * s0 + s2 * s1 * c0,
          s1, -c1 * s0, c1 * c0
          ),
        Vector3d (0., 0., 0.))
      * model.X_T[joint_id];

    model.multdof3_S[joint_id].setZero();

    model.multdof3_S[joint_id](0,0) = c2 * c1;
    model.multdof3_S[joint_id](0,1) = s2;

    model.multdof3_S[joint_id](1,0) = -s2 * c1;
    model.multdof3_S[joint_id](1,1) = c2;

    model.multdof3_S[joint_id](2,0) = s1;
    model.multdof3_S[joint_id](2,2) = 1.;
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerYXZ ) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_lambda[joint_id] = SpatialTransform (
        Matrix3d(
          c2 * c0 + s2 * s1 * s0, s2 * c1, -c2 * s0 + s2 * s1 * c0,
          -s2 * c0 + c2 * s1 * s0, c2 * c1, s2 * s0 + c2 * s1 * c0,
          c1 * s0, - s1, c1 * c0
          ),
        Vector3d (0., 0., 0.))
      * model.X_T[joint_id];

    model.multdof3_S[joint_id].setZero();

    model.multdof3_S[joint_id](0,0) = s2 * c1;
    model.multdof3_S[joint_id](0,1) = c2;

    model.multdof3_S[joint_id](1,0) = c2 * c1;
    model.multdof3_S[joint_id](1,1) = -s2;

    model.multdof3_S[joint_id](2,0) = -s1;
    model.multdof3_S[joint_id](2,2) = 1.;
  } else if (model.mJoints[joint_id].mJointType == JointTypeTranslationXYZ) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    model.X_lambda[joint_id] = SpatialTransform (
        Matrix3d::Identity (),
        Vector3d (q0, q1, q2))
      * model.X_T[joint_id];

    model.multdof3_S[joint_id].setZero();

    model.multdof3_S[joint_id](3,0) = 1.;
    model.multdof3_S[joint_id](4,1) = 1.;
    model.multdof3_S[joint_id](5,2) = 1.;
  } else if (model.mJoints[joint_id].mJointType == JointTypeCustom) {
    const Joint &joint = model.mJoints[joint_id];
    CustomJoint *custom_joint 
      = model.mCustomJoints[joint.custom_joint_index];

    custom_joint->jcalc_X_lambda_S (model, joint_id, q);
  } else {
    throw Errors::RBDLError("Error: invalid joint type!");
  }
}